

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::generate_port_interface
          (SystemVerilogCodeGen *this,InstantiationStmt *stmt)

{
  undefined1 *puVar1;
  size_t *__k;
  undefined8 uVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined1 auVar5 [8];
  char cVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  iterator iVar12;
  mapped_type *ppSVar13;
  string *psVar14;
  string *interface_name;
  iterator iVar15;
  mapped_type *__lhs;
  InternalException *this_00;
  StmtException *this_01;
  undefined1 *puVar16;
  Generator *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>
  __i;
  undefined8 uVar17;
  long lVar18;
  basic_string_view<char> bVar19;
  string_view sVar20;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  IRNode *local_1f8;
  undefined8 local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8 [4];
  undefined1 local_1c8 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  interface_names;
  map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  debug_info;
  string internal_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> potential_name;
  shared_ptr<kratos::InterfacePort> internal_interface;
  string mod_port_name;
  undefined1 auStack_e8 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  connections;
  undefined1 auStack_c8 [8];
  shared_ptr<kratos::InterfaceRef> i;
  undefined1 auStack_88 [8];
  string external_name;
  vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
  ports;
  allocator_type local_31;
  
  puVar16 = &(this->stream_).super_stringstream.field_0x10;
  if ((stmt->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    poVar9 = std::operator<<((ostream *)puVar16,"();");
    puVar16 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar16 = *(long *)puVar16 + 1;
    std::operator<<(poVar9,'\n');
    return;
  }
  poVar9 = std::operator<<((ostream *)puVar16," (");
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar9,'\n');
  this->indent_ = this->indent_ + 1;
  external_name.field_2._8_8_ = 0;
  std::
  vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
  ::reserve((vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
             *)((long)&external_name.field_2 + 8),
            (stmt->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var10 = (stmt->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      uVar17 = external_name.field_2._8_8_,
      (_Rb_tree_header *)p_Var10 != &(stmt->port_mapping_)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    std::
    vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>
    ::emplace_back<std::pair<kratos::Port*const,kratos::Var*>const&>
              ((vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>
                *)(external_name.field_2._M_local_buf + 8),
               (pair<kratos::Port_*const,_kratos::Var_*> *)(p_Var10 + 1));
  }
  if (external_name.field_2._8_8_ != 0) {
    lVar4 = -external_name.field_2._8_8_;
    uVar11 = lVar4 >> 4;
    lVar18 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>>
              (external_name.field_2._8_8_,0,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar4 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>>
                (uVar17,0);
    }
    else {
      lVar18 = uVar17 + 0x100;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>>
                (uVar17,lVar18);
      for (; lVar18 != 0; lVar18 = lVar18 + 0x10) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,__gnu_cxx::__ops::_Val_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__0>>
                  (lVar18);
      }
    }
  }
  uVar17 = external_name.field_2._8_8_;
  if (external_name.field_2._8_8_ != 0) {
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>,_std::pair<kratos::Port_*,_kratos::Var_*>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>,_std::pair<kratos::Port_*,_kratos::Var_*>_>
                         *)auStack_c8,
                        (__normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>
                         )external_name.field_2._8_8_,
                        (((long)-external_name.field_2._8_8_ >> 4) + 1) / 2);
    if (i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__1>>
                (uVar17,0);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<kratos::Port*,kratos::Var*>*,std::vector<std::pair<kratos::Port*,kratos::Var*>,std::allocator<std::pair<kratos::Port*,kratos::Var*>>>>,std::pair<kratos::Port*,kratos::Var*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<kratos::SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt*)::__1>>
                (uVar17,0,i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,
                 i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>,_std::pair<kratos::Port_*,_kratos::Var_*>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<kratos::Port_*,_kratos::Var_*>_*,_std::vector<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>_>,_std::pair<kratos::Port_*,_kratos::Var_*>_>
                *)auStack_c8);
  }
  std::
  _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  ::_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
              *)&interface_names._M_h._M_single_bucket,&(stmt->port_debug_)._M_t);
  local_1c8 = (undefined1  [8])&interface_names._M_h._M_rehash_policy._M_next_resize;
  interface_names._M_h._M_buckets = (__buckets_ptr)0x1;
  interface_names._M_h._M_bucket_count = 0;
  interface_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  interface_names._M_h._M_element_count._0_4_ = 0x3f800000;
  interface_names._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  interface_names._M_h._M_rehash_policy._4_4_ = 0;
  interface_names._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_e8 = (undefined1  [8])0x0;
  connections.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  connections.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)auStack_e8,(long)-external_name.field_2._8_8_ >> 4);
  __k = &debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar17 = external_name.field_2._8_8_;
  do {
    if ((undefined8 *)uVar17 == (undefined8 *)0x0) {
      lVar18 = 0x20;
      for (uVar11 = 0; auVar5 = auStack_e8,
          uVar11 < (ulong)((long)connections.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 6);
          uVar11 = uVar11 + 1) {
        sVar20 = indent(this);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar16,sVar20._M_str,sVar20._M_len);
        poVar9 = std::operator<<(poVar9,".");
        poVar9 = std::operator<<(poVar9,(string *)((long)auVar5 + lVar18 + -0x20));
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = std::operator<<(poVar9,(string *)
                                        ((long)&(((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar5)->_M_dataplus)._M_p + lVar18));
        std::operator<<(poVar9,")");
        poVar9 = (ostream *)puVar16;
        if (uVar11 != ((long)connections.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 6) - 1U
           ) {
          poVar9 = std::operator<<((ostream *)puVar16,",");
        }
        puVar1 = &(this->stream_).super_stringstream.field_0x90;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        std::operator<<(poVar9,'\n');
        lVar18 = lVar18 + 0x40;
      }
      sVar20 = pre_indent(this);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar16,sVar20._M_str,sVar20._M_len);
      poVar9 = std::operator<<(poVar9,");");
      puVar16 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar16 = *(long *)puVar16 + 1;
      poVar9 = std::operator<<(poVar9,'\n');
      puVar16 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar16 = *(long *)puVar16 + 1;
      std::operator<<(poVar9,'\n');
      this->indent_ = this->indent_ - 1;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_e8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_1c8);
      std::
      _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
      ::~_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                   *)&interface_names._M_h._M_single_bucket);
      std::
      _Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
      ::~_Vector_base((_Vector_base<std::pair<kratos::Port_*,_kratos::Var_*>,_std::allocator<std::pair<kratos::Port_*,_kratos::Var_*>_>_>
                       *)((long)&external_name.field_2 + 8));
      return;
    }
    if (this->generator_->debug == true) {
      auStack_c8 = *(undefined1 (*) [8])uVar17;
      iVar12 = std::
               _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
               ::find((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                       *)&interface_names._M_h._M_single_bucket,(key_type *)auStack_c8);
      if (iVar12._M_node != (_Base_ptr)&debug_info) {
        uVar2 = *(undefined8 *)&(this->stream_).super_stringstream.field_0x90;
        auStack_c8 = *(undefined1 (*) [8])uVar17;
        ppSVar13 = std::
                   map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                   ::at((map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
                         *)&interface_names._M_h._M_single_bucket,(key_type *)auStack_c8);
        ((*ppSVar13)->super_IRNode).verilog_ln = (uint32_t)uVar2;
      }
    }
    debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&internal_name._M_string_length;
    internal_name._M_dataplus._M_p = (pointer)0x0;
    auStack_88 = (undefined1  [8])&external_name._M_string_length;
    external_name._M_dataplus._M_p = (pointer)0x0;
    internal_name._M_string_length._0_1_ = 0;
    external_name._M_string_length._0_1_ = 0;
    iVar8 = (**stmt->_vptr_InstantiationStmt)(stmt);
    if (iVar8 == 1) {
      std::__cxx11::string::_M_assign((string *)__k);
      std::__cxx11::string::_M_assign((string *)auStack_88);
LAB_0019659b:
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88);
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)auStack_e8,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_c8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)auStack_c8);
    }
    else {
      cVar6 = (**(code **)(**(long **)uVar17 + 0xe8))(*(long **)uVar17);
      if (cVar6 == '\0') {
        (**(code **)(**(long **)uVar17 + 0xf8))((Generator *)auStack_c8);
        std::__cxx11::string::operator=((string *)__k,(string *)auStack_c8);
        std::__cxx11::string::~string((string *)auStack_c8);
        (**(code **)(**(long **)(uVar17 + 8) + 0xf8))((Generator *)auStack_c8);
        std::__cxx11::string::operator=((string *)auStack_88,(string *)auStack_c8);
        std::__cxx11::string::~string((string *)auStack_c8);
        goto LAB_0019659b;
      }
      Var::as<kratos::InterfacePort>((Var *)((long)&potential_name.field_2 + 8));
      if (potential_name.field_2._8_8_ == 0) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_c8,"Unable to cast port",
                   (allocator<char> *)
                   &internal_interface.
                    super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        InternalException::InternalException(this_00,(string *)auStack_c8);
        __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar3 = *(undefined8 **)(potential_name.field_2._8_8_ + 0x280);
      std::__cxx11::string::_M_assign((string *)__k);
      cVar6 = (**(code **)(*(long *)*puVar3 + 0x40))();
      if (cVar6 == '\0') {
        (**(code **)(**(long **)(uVar17 + 8) + 0x138))((Generator *)auStack_c8);
        std::__cxx11::string::operator=((string *)auStack_88,(string *)auStack_c8);
        this_02 = (Generator *)auStack_c8;
      }
      else {
        psVar14 = (string *)(**(code **)(*(long *)*puVar3 + 0x30))();
        std::__cxx11::string::string
                  ((string *)
                   &internal_interface.
                    super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,psVar14);
        (**(code **)(**(long **)(uVar17 + 8) + 0x138))((Generator *)auStack_c8);
        std::__cxx11::string::operator=((string *)auStack_88,(string *)auStack_c8);
        std::__cxx11::string::~string((string *)auStack_c8);
        auStack_c8 = auStack_88;
        i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)external_name._M_dataplus._M_p;
        i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
             internal_interface.
             super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        bVar19 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
        format_str.data_ = (char *)bVar19.size_;
        format_str.size_ = 0xdd;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_c8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)((long)&internal_name.field_2 + 8),(detail *)bVar19.data_,format_str,
                   args);
        interface_name = (string *)(**(code **)(**(long **)(uVar17 + 8) + 0x68))();
        Generator::get_interface((Generator *)auStack_c8,interface_name);
        if ((auStack_c8 != (undefined1  [8])0x0) &&
           (cVar6 = (**(code **)(**(long **)auStack_c8 + 0x40))(), cVar6 == '\0')) {
          std::__cxx11::string::_M_assign((string *)auStack_88);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&i);
        std::__cxx11::string::~string((string *)(internal_name.field_2._M_local_buf + 8));
        this_02 = (Generator *)
                  &internal_interface.
                   super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
      }
      std::__cxx11::string::~string((string *)this_02);
      iVar15 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1c8,(key_type *)__k);
      if (iVar15.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_1c8,__k,auStack_88);
      }
      else {
        __lhs = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)local_1c8,(key_type *)__k);
        bVar7 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)auStack_88);
        if (bVar7) {
          this_01 = (StmtException *)__cxa_allocate_exception(0x10);
          (**(code **)(**(long **)uVar17 + 0x100))((undefined1 *)((long)&internal_name.field_2 + 8))
          ;
          (**(code **)(**(long **)(uVar17 + 8) + 0x100))(local_1e8);
          auStack_c8 = (undefined1  [8])internal_name.field_2._8_8_;
          i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)potential_name._M_dataplus._M_p;
          i.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_1e8[0];
          bVar19 = fmt::v7::to_string_view<char,_0>
                             ("{0} and {1} are not from the same interface definition");
          format_str_00.data_ = (char *)bVar19.size_;
          format_str_00.size_ = 0xdd;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)auStack_c8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)
                     &internal_interface.
                      super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(detail *)bVar19.data_,format_str_00,args_00);
          local_1f8 = *(IRNode **)uVar17;
          local_1f0 = *(undefined8 *)(uVar17 + 8);
          __l._M_len = 2;
          __l._M_array = &local_1f8;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_c8,__l,
                     &local_31);
          StmtException::StmtException
                    (this_01,(string *)
                             &internal_interface.
                              super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,
                     (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_c8);
          __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&internal_interface);
      if (iVar15.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_0019659b;
    }
    std::__cxx11::string::~string((string *)auStack_88);
    std::__cxx11::string::~string((string *)__k);
    uVar17 = uVar17 + 0x10;
  } while( true );
}

Assistant:

void SystemVerilogCodeGen::generate_port_interface(kratos::InstantiationStmt* stmt) {
    if (stmt->port_mapping().empty()) {
        stream_ << "();" << stream_.endl();
        return;
    }
    stream_ << " (" << stream_.endl();
    indent_++;
    std::vector<std::pair<Port*, Var*>> ports;
    auto const& mapping = stmt->port_mapping();
    ports.reserve(mapping.size());
    for (auto const& iter : mapping) ports.emplace_back(iter);
    std::sort(ports.begin(), ports.end(),
              [](const auto& lhs, const auto& rhs) { return lhs.first->name < rhs.first->name; });
    // sort again based on the input and output
    // use stable sort to preserve the previous order
    std::stable_sort(ports.begin(), ports.end(), [](const auto& lhs, const auto& rhs) {
        return lhs.first->port_direction() == PortDirection::In &&
               rhs.first->port_direction() == PortDirection::Out;
    });

    auto debug_info = stmt->port_debug();
    std::unordered_map<std::string, std::string> interface_names;
    std::vector<std::pair<std::string, std::string>> connections;
    connections.reserve(ports.size());
    for (auto const& [internal, external] : ports) {
        if (generator_->debug && debug_info.find(internal) != debug_info.end()) {
            debug_info.at(internal)->verilog_ln = stream_.line_no();
        }
        std::string internal_name;
        std::string external_name;
        if (stmt->instantiation_type() == InstantiationStmt::InstantiationType::Interface) {
            internal_name = internal->name;
            external_name = external->name;
        } else {
            // module
            if (!internal->is_interface()) {
                internal_name = internal->to_string();
                external_name = external->to_string();
            } else {
                // we assume the interface connectivity has been checked
                // internal has to be an interface
                auto internal_interface = internal->as<InterfacePort>();
                if (!internal_interface) throw InternalException("Unable to cast port");
                const auto* internal_def = internal_interface->interface();
                internal_name = internal_def->name();
                if (internal_def->definition()->is_modport()) {
                    // it's a mod port
                    // get the mod port name
                    auto mod_port_name = internal_def->definition()->name();
                    external_name = external->base_name();
                    // FIXME: this is a little bit hacky here
                    auto potential_name = ::format("{0}.{1}", external_name, mod_port_name);
                    auto i = external->generator()->get_interface(external_name);
                    if (i && !i->definition()->is_modport()) {
                        external_name = potential_name;
                    }
                } else {
                    external_name = external->base_name();
                }

                if (interface_names.find(internal_name) != interface_names.end()) {
                    if (interface_names.at(internal_name) != external_name) {
                        throw StmtException(
                            ::format("{0} and {1} are not from the same interface definition",
                                     internal->handle_name(), external->handle_name()),
                            {internal, external});
                    }
                    continue;
                }
                interface_names.emplace(internal_name, external_name);
            }
        }
        connections.emplace_back(std::make_pair(internal_name, external_name));
    }
    for (uint64_t i = 0; i < connections.size(); i++) {
        auto const& [internal_name, external_name] = connections[i];
        stream_ << indent() << "." << internal_name << "(" << external_name << ")";
        if (i != connections.size() - 1)
            stream_ << "," << stream_.endl();
        else
            stream_ << stream_.endl();
    }
    stream_ << pre_indent() << ");" << stream_.endl() << stream_.endl();
    indent_--;
}